

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo
               (SnapObject *snpObject,FileWriter *writer)

{
  TTD_PTR_ID *pTVar1;
  ulong uVar2;
  
  if (snpObject->SnapObjectTag == SnapBoundFunctionObject) {
    pTVar1 = (TTD_PTR_ID *)snpObject->AddtlSnapObjectInfo;
    FileWriter::WriteAddr(writer,boundFunction,*pTVar1,CommaAndBigSpaceSeparator);
    FileWriter::WriteAddr(writer,boundThis,pTVar1[1],CommaSeparator);
    FileWriter::WriteLengthValue(writer,(uint32)pTVar1[2],CommaSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x46,3);
    (*writer->_vptr_FileWriter[4])(writer,0);
    if ((int)pTVar1[2] != 0) {
      uVar2 = 0;
      do {
        NSSnapValues::EmitTTDVar(*(TTDVar *)(pTVar1[3] + uVar2 * 8),writer,uVar2 != 0);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (uint)pTVar1[2]);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void EmitAddtlInfo_SnapBoundFunctionInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapBoundFunctionInfo* snapBoundInfo = SnapObjectGetAddtlInfoAs<SnapBoundFunctionInfo*, SnapObjectType::SnapBoundFunctionObject>(snpObject);

            writer->WriteAddr(NSTokens::Key::boundFunction, snapBoundInfo->TargetFunction, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteAddr(NSTokens::Key::boundThis, snapBoundInfo->BoundThis, NSTokens::Separator::CommaSeparator);
            writer->WriteLengthValue(snapBoundInfo->ArgCount, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::boundArgs, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < snapBoundInfo->ArgCount; ++i)
            {
                NSSnapValues::EmitTTDVar(snapBoundInfo->ArgArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }